

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O2

fvar<float,_2UL> __thiscall
ising::free_energy::triangular::anon_unknown_4::
functor<float,_boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>_>::operator()
          (functor<float,_boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>_>
           *this,float t1,float t2)

{
  array<float,_3UL> aVar1;
  float local_94;
  float local_90;
  float local_8c;
  array<float,_3UL> local_88;
  array<float,_3UL> local_78;
  array<float,_3UL> local_68;
  array<float,_3UL> local_58;
  array<float,_3UL> local_48;
  array<float,_3UL> local_38;
  array<float,_3UL> local_28;
  
  local_8c = cosf(t1);
  local_68._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*
                        (&this->sh2a_,&local_8c);
  local_58._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>::operator-
                        (&this->cshabc_,(fvar<float,_2UL> *)&local_68);
  local_90 = cosf(t2);
  local_78._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*
                        (&this->sh2b_,&local_90);
  local_48._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>::operator-
                        ((fvar<float,_2UL> *)&local_58,(fvar<float,_2UL> *)&local_78);
  local_94 = cosf(t1 + t2);
  local_88._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*
                        (&this->sh2c_,&local_94);
  local_38._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>::operator-
                        ((fvar<float,_2UL> *)&local_48,(fvar<float,_2UL> *)&local_88);
  local_28._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::log<float,2ul>
                        ((fvar<float,_2UL> *)&local_38);
  aVar1._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*
                        ((fvar<float,_2UL> *)&local_28,&this->c_);
  return (array<float,_3UL>)(array<float,_3UL>)aVar1._M_elems;
}

Assistant:

FVAR operator()(T t1, T t2) const {
    using std::cos;
    using std::log;
    return c_ * log(cshabc_ - sh2a_ * cos(t1) - sh2b_ * cos(t2) -
                    sh2c_ * cos(t1 + t2));
  }